

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_new_uninitialized(qpdf_data qpdf)

{
  qpdf_data qpdf_00;
  qpdf_oh qVar1;
  QPDFObjectHandle local_28;
  qpdf_data local_10;
  qpdf_data qpdf_local;
  
  local_10 = qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_oh_new_uninitialized",0);
  qpdf_00 = local_10;
  local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QPDFObjectHandle::QPDFObjectHandle(&local_28);
  qVar1 = new_object(qpdf_00,&local_28);
  QPDFObjectHandle::~QPDFObjectHandle(&local_28);
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_uninitialized(qpdf_data qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_uninitialized");
    return new_object(qpdf, QPDFObjectHandle());
}